

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Own<kj::WebSocket,_std::nullptr_t> __thiscall
kj::HttpServer::Connection::sendWebSocketError(Connection *this,StringPtr errorMessage)

{
  String *__return_storage_ptr__;
  ProtocolError protocolError;
  Exception *exception_00;
  char *in_RCX;
  StringPtr *in_R8;
  undefined4 uStack_20c;
  StringPtr SStack_208;
  Connection *local_1f8;
  char *pcStack_1f0;
  ArrayPtr<char> local_1e8;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [8];
  Exception exception;
  Connection *this_local;
  StringPtr errorMessage_local;
  
  this_local = (Connection *)errorMessage.content.size_;
  __return_storage_ptr__ = (String *)(local_1d8 + 8);
  exception.details.builder.disposer = (ArrayDisposer *)errorMessage.content.ptr;
  errorMessage_local.content.ptr = in_RCX;
  errorMessage_local.content.size_ = (size_t)this;
  kj::_::Debug::makeDescription<char_const(&)[33],kj::StringPtr&>
            (__return_storage_ptr__,(Debug *)"\"received bad WebSocket handshake\", errorMessage",
             "received bad WebSocket handshake",(char (*) [33])&this_local,in_R8);
  Exception::Exception
            ((Exception *)local_1b8,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1f7f,__return_storage_ptr__);
  String::~String(__return_storage_ptr__);
  StringPtr::StringPtr(&SStack_208,"Bad Request");
  local_1f8 = this_local;
  pcStack_1f0 = errorMessage_local.content.ptr;
  ArrayPtr<char>::ArrayPtr(&local_1e8,(void *)0x0);
  protocolError._4_4_ = uStack_20c;
  protocolError.statusCode = 400;
  protocolError.statusMessage.content.ptr = SStack_208.content.ptr;
  protocolError.statusMessage.content.size_ = SStack_208.content.size_;
  protocolError.description.content.ptr = (char *)local_1f8;
  protocolError.description.content.size_ = (size_t)pcStack_1f0;
  protocolError.rawContent.ptr = local_1e8.ptr;
  protocolError.rawContent.size_ = local_1e8.size_;
  sendError((Connection *)local_1d8,protocolError);
  Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::operator=
            ((Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *)
             ((ArrayDisposer *)errorMessage.content.ptr + 0x2d),
             (Promise<kj::HttpServer::Connection::LoopResult> *)local_1d8);
  Promise<kj::HttpServer::Connection::LoopResult>::~Promise
            ((Promise<kj::HttpServer::Connection::LoopResult> *)local_1d8);
  exception_00 = mv<kj::Exception>((Exception *)local_1b8);
  throwFatalException(exception_00,0);
}

Assistant:

kj::Own<WebSocket> sendWebSocketError(StringPtr errorMessage) {
    // The client committed a protocol error during a WebSocket handshake. We will send an error
    // response back to them, and throw an exception from `acceptWebSocket()` to our app. We'll
    // label this as a DISCONNECTED exception, as if the client had simply closed the connection
    // rather than committing a protocol error. This is intended to let the server know that it
    // wasn't an error on the server's part. (This is a big of a hack...)
    kj::Exception exception = KJ_EXCEPTION(DISCONNECTED,
        "received bad WebSocket handshake", errorMessage);
    webSocketError = sendError(
        HttpHeaders::ProtocolError { 400, "Bad Request", errorMessage, nullptr });
    kj::throwFatalException(kj::mv(exception));
  }